

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int asciiToAscii(uchar *out,int *poutlen,uchar *in,int *pinlen,void *vctxt)

{
  int iVar1;
  int local_54;
  uint c;
  int ret;
  int outlen;
  int inlen;
  uchar *instart;
  uchar *inend;
  void *vctxt_local;
  int *pinlen_local;
  uchar *in_local;
  int *poutlen_local;
  uchar *out_local;
  
  if (in == (uchar *)0x0) {
    *pinlen = 0;
    *poutlen = 0;
    out_local._4_4_ = 0;
  }
  else {
    local_54 = *pinlen;
    ret = local_54;
    if (*poutlen < local_54) {
      local_54 = -3;
      ret = *poutlen;
    }
    *poutlen = ret;
    *pinlen = ret;
    pinlen_local = (int *)in;
    poutlen_local = (int *)out;
    while (pinlen_local < in + ret) {
      iVar1 = *pinlen_local;
      if (0x7f < (byte)iVar1) {
        *poutlen = (int)pinlen_local - (int)in;
        *pinlen = (int)pinlen_local - (int)in;
        return -2;
      }
      pinlen_local = (int *)((long)pinlen_local + 1);
      *(byte *)poutlen_local = (byte)iVar1;
      poutlen_local = (int *)((long)poutlen_local + 1);
    }
    out_local._4_4_ = local_54;
  }
  return out_local._4_4_;
}

Assistant:

static int
asciiToAscii(unsigned char* out, int *poutlen,
             const unsigned char* in, int *pinlen,
             void *vctxt ATTRIBUTE_UNUSED) {
    const unsigned char *inend;
    const unsigned char *instart = in;
    int inlen, outlen, ret;

    if (in == NULL) {
        *pinlen = 0;
        *poutlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    inlen = *pinlen;
    outlen = *poutlen;

    if (outlen < inlen) {
        inlen = outlen;
        ret = XML_ENC_ERR_SPACE;
    } else {
        ret = inlen;
    }

    inend = in + inlen;
    *poutlen = inlen;
    *pinlen = inlen;

    while (in < inend) {
	unsigned c = *in;

        if (c >= 0x80) {
	    *poutlen = in - instart;
	    *pinlen = in - instart;
	    return(XML_ENC_ERR_INPUT);
	}

        in++;
	*out++ = c;
    }

    return(ret);
}